

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::Prim::Prim<tinyusdz::GeomMesh>(Prim *this,GeomMesh *prim)

{
  _Rb_tree_header *p_Var1;
  
  (this->_abs_path)._prim_part._M_dataplus._M_p = (pointer)&(this->_abs_path)._prim_part.field_2;
  (this->_abs_path)._prim_part._M_string_length = 0;
  (this->_abs_path)._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._prop_part._M_dataplus._M_p = (pointer)&(this->_abs_path)._prop_part.field_2;
  (this->_abs_path)._prop_part._M_string_length = 0;
  (this->_abs_path)._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._variant_part._M_dataplus._M_p =
       (pointer)&(this->_abs_path)._variant_part.field_2;
  (this->_abs_path)._variant_part._M_string_length = 0;
  (this->_abs_path)._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_abs_path)._variant_selection_part.field_2;
  (this->_abs_path)._variant_selection_part._M_string_length = 0;
  (this->_abs_path)._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_abs_path)._variant_part_str.field_2;
  (this->_abs_path)._variant_part_str._M_string_length = 0;
  (this->_abs_path)._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._element._M_dataplus._M_p = (pointer)&(this->_abs_path)._element.field_2;
  (this->_abs_path)._element._M_string_length = 0;
  (this->_abs_path)._element.field_2._M_local_buf[0] = '\0';
  (this->_abs_path)._path_type.has_value_ = false;
  (this->_abs_path)._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_abs_path)._valid = false;
  (this->_path)._prim_part._M_dataplus._M_p = (pointer)&(this->_path)._prim_part.field_2;
  (this->_path)._prim_part._M_string_length = 0;
  (this->_path)._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._prop_part._M_dataplus._M_p = (pointer)&(this->_path)._prop_part.field_2;
  (this->_path)._prop_part._M_string_length = 0;
  (this->_path)._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_part._M_dataplus._M_p = (pointer)&(this->_path)._variant_part.field_2;
  (this->_path)._variant_part._M_string_length = 0;
  (this->_path)._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_path)._variant_selection_part.field_2;
  (this->_path)._variant_selection_part._M_string_length = 0;
  (this->_path)._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_path)._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_path)._variant_part_str.field_2;
  (this->_path)._variant_part_str._M_string_length = 0;
  (this->_path)._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_path)._element._M_dataplus._M_p = (pointer)&(this->_path)._element.field_2;
  (this->_path)._element._M_string_length = 0;
  (this->_path)._element.field_2._M_local_buf[0] = '\0';
  (this->_path)._path_type.has_value_ = false;
  (this->_path)._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_path)._valid = false;
  (this->_elementPath)._prim_part._M_dataplus._M_p =
       (pointer)&(this->_elementPath)._prim_part.field_2;
  (this->_elementPath)._prim_part._M_string_length = 0;
  (this->_elementPath)._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._prop_part._M_dataplus._M_p =
       (pointer)&(this->_elementPath)._prop_part.field_2;
  (this->_elementPath)._prop_part._M_string_length = 0;
  (this->_elementPath)._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._variant_part._M_dataplus._M_p =
       (pointer)&(this->_elementPath)._variant_part.field_2;
  (this->_elementPath)._variant_part._M_string_length = 0;
  (this->_elementPath)._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_elementPath)._variant_selection_part.field_2;
  (this->_elementPath)._variant_selection_part._M_string_length = 0;
  (this->_elementPath)._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_elementPath)._variant_part_str.field_2;
  (this->_elementPath)._variant_part_str._M_string_length = 0;
  (this->_elementPath)._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._element._M_dataplus._M_p = (pointer)&(this->_elementPath)._element.field_2;
  (this->_elementPath)._element._M_string_length = 0;
  (this->_elementPath)._element.field_2._M_local_buf[0] = '\0';
  (this->_elementPath)._path_type.has_value_ = false;
  (this->_elementPath)._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_elementPath)._valid = false;
  (this->_prim_type_name)._M_dataplus._M_p = (pointer)&(this->_prim_type_name).field_2;
  (this->_prim_type_name)._M_string_length = 0;
  (this->_prim_type_name).field_2._M_local_buf[0] = '\0';
  this->_specifier = Invalid;
  (this->_data).v_.vtable = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  (this->_data).v_.storage.dynamic = (void *)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primChildrenIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_prim_id = -1;
  p_Var1 = &(this->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set_primdata<tinyusdz::GeomMesh>(this,prim);
  return;
}

Assistant:

Prim(const T &prim) {
    set_primdata(prim);
  }